

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.h
# Opt level: O1

void __thiscall IGameController::CheckReadyStates(IGameController *this,int WithoutID)

{
  CPlayer *pCVar1;
  ulong uVar2;
  bool bVar3;
  
  if (this->m_pConfig->m_SvPlayerReadyMode != 0) {
    if (this->m_GameState == IGS_GAME_PAUSED) {
      uVar2 = 0;
      bVar3 = false;
      do {
        if (((((uint)WithoutID != uVar2) &&
             (pCVar1 = this->m_pGameServer->m_apPlayers[uVar2], pCVar1 != (CPlayer *)0x0)) &&
            (pCVar1->m_Team != -1)) && (pCVar1->m_IsReadyToPlay != true)) break;
        bVar3 = 0x3e < uVar2;
        uVar2 = uVar2 + 1;
      } while (uVar2 != 0x40);
      if (bVar3) {
        SetGameState(this,IGS_GAME_PAUSED,0);
        return;
      }
    }
    else if (this->m_GameState == IGS_WARMUP_USER) {
      uVar2 = 0;
      bVar3 = false;
      do {
        if ((((uint)WithoutID != uVar2) &&
            (pCVar1 = this->m_pGameServer->m_apPlayers[uVar2], pCVar1 != (CPlayer *)0x0)) &&
           ((pCVar1->m_Team != -1 && (pCVar1->m_IsReadyToPlay != true)))) break;
        bVar3 = 0x3e < uVar2;
        uVar2 = uVar2 + 1;
      } while (uVar2 != 0x40);
      if (bVar3) {
        StartMatch(this);
        return;
      }
    }
  }
  return;
}

Assistant:

CConfig *Config() const { return m_pConfig; }